

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

raw_quasi_adaptive_huffman_data_model * __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::operator=
          (raw_quasi_adaptive_huffman_data_model *this,raw_quasi_adaptive_huffman_data_model *rhs)

{
  vector<unsigned_short> *this_00;
  vector<unsigned_char> *this_01;
  unsigned_short *p;
  decoder_tables *other;
  uint32 *puVar1;
  uint16 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  decoder_tables *this_02;
  decoder_tables *pdVar9;
  
  if (this == rhs) {
    return this;
  }
  uVar3 = rhs->m_max_cycle;
  uVar4 = rhs->m_update_cycle;
  uVar5 = rhs->m_symbols_until_update;
  this->m_total_syms = rhs->m_total_syms;
  this->m_max_cycle = uVar3;
  this->m_update_cycle = uVar4;
  this->m_symbols_until_update = uVar5;
  this->m_total_count = rhs->m_total_count;
  if ((this->m_sym_freq).m_capacity < (rhs->m_sym_freq).m_size) {
    p = (this->m_sym_freq).m_p;
    if (p != (unsigned_short *)0x0) {
      lzham_free(p);
      (this->m_sym_freq).m_p = (unsigned_short *)0x0;
      (this->m_sym_freq).m_size = 0;
      (this->m_sym_freq).m_capacity = 0;
    }
    bVar8 = elemental_vector::increase_capacity
                      ((elemental_vector *)this,(rhs->m_sym_freq).m_size,false,2,(object_mover)0x0,
                       false);
    if (bVar8) goto LAB_0011db6f;
    lzham_fail("\"lzham::vector operator=: Out of memory!\"",
               "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/decomp/lzham_vector.h"
               ,0x60);
  }
  else {
    if ((this->m_sym_freq).m_size != 0) {
      (this->m_sym_freq).m_size = 0;
    }
LAB_0011db6f:
    memcpy((this->m_sym_freq).m_p,(rhs->m_sym_freq).m_p,(ulong)(rhs->m_sym_freq).m_size * 2);
    (this->m_sym_freq).m_size = (rhs->m_sym_freq).m_size;
  }
  if (this != rhs) {
    if ((this->m_codes).m_capacity < (rhs->m_codes).m_size) {
      this_00 = &this->m_codes;
      if (this_00->m_p != (unsigned_short *)0x0) {
        lzham_free(this_00->m_p);
        this_00->m_p = (unsigned_short *)0x0;
        (this->m_codes).m_size = 0;
        (this->m_codes).m_capacity = 0;
      }
      bVar8 = elemental_vector::increase_capacity
                        ((elemental_vector *)this_00,(rhs->m_codes).m_size,false,2,(object_mover)0x0
                         ,false);
      if (!bVar8) {
        lzham_fail("\"lzham::vector operator=: Out of memory!\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/decomp/lzham_vector.h"
                   ,0x60);
        goto LAB_0011dc11;
      }
    }
    else if ((this->m_codes).m_size != 0) {
      (this->m_codes).m_size = 0;
    }
    memcpy((this->m_codes).m_p,(rhs->m_codes).m_p,(ulong)(rhs->m_codes).m_size * 2);
    (this->m_codes).m_size = (rhs->m_codes).m_size;
  }
LAB_0011dc11:
  if (this != rhs) {
    if ((this->m_code_sizes).m_capacity < (rhs->m_code_sizes).m_size) {
      this_01 = &this->m_code_sizes;
      if (this_01->m_p != (uchar *)0x0) {
        lzham_free(this_01->m_p);
        this_01->m_p = (uchar *)0x0;
        (this->m_code_sizes).m_size = 0;
        (this->m_code_sizes).m_capacity = 0;
      }
      bVar8 = elemental_vector::increase_capacity
                        ((elemental_vector *)this_01,(rhs->m_code_sizes).m_size,false,1,
                         (object_mover)0x0,false);
      if (!bVar8) {
        lzham_fail("\"lzham::vector operator=: Out of memory!\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/decomp/lzham_vector.h"
                   ,0x60);
        goto LAB_0011dc93;
      }
    }
    else if ((this->m_code_sizes).m_size != 0) {
      (this->m_code_sizes).m_size = 0;
    }
    memcpy((this->m_code_sizes).m_p,(rhs->m_code_sizes).m_p,(ulong)(rhs->m_code_sizes).m_size);
    (this->m_code_sizes).m_size = (rhs->m_code_sizes).m_size;
  }
LAB_0011dc93:
  other = rhs->m_pDecode_tables;
  pdVar9 = this->m_pDecode_tables;
  if (other == (decoder_tables *)0x0) {
    if (pdVar9 != (decoder_tables *)0x0) {
      puVar1 = pdVar9->m_lookup;
      if ((puVar1 != (uint32 *)0x0) && ((puVar1[-2] ^ puVar1[-1]) == 0xffffffff)) {
        lzham_free(puVar1 + -4);
      }
      puVar2 = pdVar9->m_sorted_symbol_order;
      if ((puVar2 != (uint16 *)0x0) &&
         ((*(uint *)(puVar2 + -4) ^ *(uint *)(puVar2 + -2)) == 0xffffffff)) {
        lzham_free(puVar2 + -8);
      }
      lzham_free(pdVar9);
    }
    this->m_pDecode_tables = (decoder_tables *)0x0;
  }
  else if (pdVar9 == (decoder_tables *)0x0) {
    this_02 = (decoder_tables *)lzham_malloc(0xc0,(size_t *)0x0);
    pdVar9 = (decoder_tables *)0x0;
    if (this_02 != (decoder_tables *)0x0) {
      this_02->m_table_shift = 0;
      this_02->m_table_max_code = 0;
      this_02->m_decode_start_code_size = 0;
      this_02->m_sorted_symbol_order = (uint16 *)0x0;
      *(undefined8 *)&this_02->m_cur_lookup_size = 0;
      *(undefined8 *)((long)&this_02->m_lookup + 4) = 0;
      prefix_coding::decoder_tables::operator=(this_02,other);
      pdVar9 = this_02;
    }
    this->m_pDecode_tables = pdVar9;
    if (pdVar9 == (decoder_tables *)0x0) {
      clear(this);
      return this;
    }
  }
  else {
    prefix_coding::decoder_tables::operator=(pdVar9,other);
  }
  bVar8 = rhs->m_encoding;
  bVar6 = rhs->m_fast_updating;
  bVar7 = rhs->m_use_polar_codes;
  this->m_decoder_table_bits = rhs->m_decoder_table_bits;
  this->m_encoding = bVar8;
  this->m_fast_updating = bVar6;
  this->m_use_polar_codes = bVar7;
  return this;
}

Assistant:

raw_quasi_adaptive_huffman_data_model& raw_quasi_adaptive_huffman_data_model::operator= (const raw_quasi_adaptive_huffman_data_model& rhs)
   {
      if (this == &rhs)
         return *this;

      m_total_syms = rhs.m_total_syms;

      m_max_cycle = rhs.m_max_cycle;
      m_update_cycle = rhs.m_update_cycle;
      m_symbols_until_update = rhs.m_symbols_until_update;

      m_total_count = rhs.m_total_count;

      m_sym_freq = rhs.m_sym_freq;

      m_codes = rhs.m_codes;
      m_code_sizes = rhs.m_code_sizes;

      if (rhs.m_pDecode_tables)
      {
         if (m_pDecode_tables)
            *m_pDecode_tables = *rhs.m_pDecode_tables;
         else
         {
            m_pDecode_tables = lzham_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
            if (!m_pDecode_tables)
            {
               clear();
               return *this;
            }
         }
      }
      else
      {
         lzham_delete(m_pDecode_tables);
         m_pDecode_tables = NULL;
      }

      m_decoder_table_bits = rhs.m_decoder_table_bits;
      m_encoding = rhs.m_encoding;
      m_fast_updating = rhs.m_fast_updating;
      m_use_polar_codes = rhs.m_use_polar_codes;

      return *this;
   }